

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

ValueType __thiscall wabt::interp::Store::GetValueType(Store *this,Ref ref)

{
  ObjectKind OVar1;
  unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_> *this_00;
  pointer this_01;
  Object *obj;
  Store *this_local;
  Ref ref_local;
  
  this_00 = FreeList<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>
            ::Get(&this->objects_,ref.index);
  this_01 = std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>::get
                      (this_00);
  OVar1 = Object::kind(this_01);
  if (OVar1 == Null) {
    Type::Type((Type *)((long)&ref_local.index + 4),Nullref);
  }
  else if (OVar1 == Foreign) {
    Type::Type((Type *)((long)&ref_local.index + 4),Hostref);
  }
  else if (OVar1 - DefinedFunc < 2) {
    Type::Type((Type *)((long)&ref_local.index + 4),Funcref);
  }
  else {
    Type::Type((Type *)((long)&ref_local.index + 4),Anyref);
  }
  return (ValueType)ref_local.index._4_4_;
}

Assistant:

ValueType Store::GetValueType(Ref ref) const {
  Object* obj = objects_.Get(ref.index).get();
  switch (obj->kind()) {
    case ObjectKind::Null:        return ValueType::Nullref;
    case ObjectKind::Foreign:     return ValueType::Hostref;
    case ObjectKind::DefinedFunc:
    case ObjectKind::HostFunc:    return ValueType::Funcref;
    default:                      return ValueType::Anyref;
  }
}